

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

void kj::anon_unknown_0::testHttpClient
               (WaitScope *waitScope,HttpHeaderTable *table,HttpClient *client,
               HttpTestCase *testCase)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  char *delim;
  InitializeableArray<kj::StringPtr> *arr;
  long lVar4;
  StringPtr *pSVar5;
  HeaderTestCase *header;
  HeaderTestCase *pHVar6;
  HttpHeaderId id;
  Array<char> local_188;
  String body;
  char local_158 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_150;
  Request request;
  Response response;
  anon_class_8_1_a389c060 _kjContextFunc536;
  StringPtr local_f0;
  HttpHeaders headers;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:536:3)>
  _kjContext536;
  
  _kjContextFunc536.testCase = testCase;
  _::Debug::Context::Context(&_kjContext536.super_Context);
  _kjContext536.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__Context_00424068;
  _kjContext536.func = &_kjContextFunc536;
  HttpHeaders::HttpHeaders(&headers,table);
  pHVar6 = (testCase->request).requestHeaders.super_Array<kj::(anonymous_namespace)::HeaderTestCase>
           .ptr;
  for (lVar4 = (testCase->request).requestHeaders.
               super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ << 5; lVar4 != 0;
      lVar4 = lVar4 + -0x20) {
    uVar1 = (pHVar6->id).table;
    uVar2 = (pHVar6->id).id;
    id.id = uVar2;
    id.table = (HttpHeaderTable *)uVar1;
    id._12_4_ = 0;
    HttpHeaders::set(&headers,id,(StringPtr)(pHVar6->value).content);
    pHVar6 = pHVar6 + 1;
  }
  delim = (testCase->request).path.content.ptr;
  local_158[0] = (testCase->request).requestBodySize.ptr.isSet;
  if ((bool)local_158[0] == true) {
    local_150 = (testCase->request).requestBodySize.ptr.field_1;
  }
  (**client->_vptr_HttpClient)
            (&request,client,(ulong)(testCase->request).method,delim,
             (testCase->request).path.content.size_,&headers,local_158);
  pSVar5 = (testCase->request).requestBodyParts.super_Array<kj::StringPtr>.ptr;
  for (lVar4 = (testCase->request).requestBodyParts.super_Array<kj::StringPtr>.size_ << 4;
      lVar4 != 0; lVar4 = lVar4 + -0x10) {
    delim = (char *)((pSVar5->content).size_ - 1);
    (**(request.body.ptr)->_vptr_AsyncOutputStream)
              (&response,request.body.ptr,(pSVar5->content).ptr);
    Promise<void>::wait((Promise<void> *)&response,waitScope);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&response);
    pSVar5 = pSVar5 + 1;
  }
  Own<kj::AsyncOutputStream>::dispose(&request.body);
  Promise<kj::HttpClient::Response>::wait
            ((Promise<kj::HttpClient::Response> *)&response,&request.response);
  if (((testCase->response).statusCode != (ulong)response.statusCode) && (_::Debug::minSeverity < 3)
     ) {
    delim = "\"failed: expected \" \"response.statusCode == testCase.response.statusCode\"";
    _::Debug::log<char_const(&)[69]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x228,ERROR,
               "\"failed: expected \" \"response.statusCode == testCase.response.statusCode\"",
               (char (*) [69])"failed: expected response.statusCode == testCase.response.statusCode"
              );
  }
  AsyncInputStream::readAllText((AsyncInputStream *)&local_188,(uint64_t)response.body.ptr);
  Promise<kj::String>::wait((Promise<kj::String> *)&body,&local_188);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_188);
  if ((testCase->request).method == HEAD) {
    local_188.ptr = "";
    local_188.size_ = 1;
    bVar3 = String::operator==(&body,(StringPtr *)&local_188);
    if (!bVar3 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x22b,ERROR,"\"failed: expected \" \"body == \\\"\\\"\"",
                 (char (*) [28])"failed: expected body == \"\"");
    }
  }
  else {
    strArray<kj::(anonymous_namespace)::InitializeableArray<kj::StringPtr>const&>
              ((String *)&local_188,(kj *)&(testCase->response).responseBodyParts,arr,delim);
    local_f0.content.ptr = local_188.ptr;
    if (local_188.size_ == 0) {
      local_f0.content.ptr = "";
    }
    local_f0.content.size_ = local_188.size_ + (local_188.size_ == 0);
    bVar3 = String::operator==(&body,&local_f0);
    Array<char>::~Array(&local_188);
    if (!bVar3 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[79],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x22d,ERROR,
                 "\"failed: expected \" \"body == kj::strArray(testCase.response.responseBodyParts, \\\"\\\")\", body"
                 ,(char (*) [79])
                  "failed: expected body == kj::strArray(testCase.response.responseBodyParts, \"\")"
                 ,&body);
    }
  }
  Array<char>::~Array(&body.content);
  Own<kj::AsyncInputStream>::dispose(&response.body);
  HttpClient::Request::~Request(&request);
  HttpHeaders::~HttpHeaders(&headers);
  _::Debug::Context::~Context(&_kjContext536.super_Context);
  return;
}

Assistant:

void testHttpClient(kj::WaitScope& waitScope, HttpHeaderTable& table,
                    HttpClient& client, const HttpTestCase& testCase) {
  KJ_CONTEXT(testCase.request.raw, testCase.response.raw);

  HttpHeaders headers(table);
  for (auto& header: testCase.request.requestHeaders) {
    headers.set(header.id, header.value);
  }

  auto request = client.request(
      testCase.request.method, testCase.request.path, headers, testCase.request.requestBodySize);
  for (auto& part: testCase.request.requestBodyParts) {
    request.body->write(part.begin(), part.size()).wait(waitScope);
  }
  request.body = nullptr;

  auto response = request.response.wait(waitScope);

  KJ_EXPECT(response.statusCode == testCase.response.statusCode);
  auto body = response.body->readAllText().wait(waitScope);
  if (testCase.request.method == HttpMethod::HEAD) {
    KJ_EXPECT(body == "");
  } else {
    KJ_EXPECT(body == kj::strArray(testCase.response.responseBodyParts, ""), body);
  }
}